

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O3

char * strstri(char *str,char *sub)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  char *pcVar10;
  ulong uVar11;
  char local_68 [32];
  char tsub [32];
  char tstr [32];
  
  bVar1 = *sub;
  if (bVar1 == 0) {
    return str;
  }
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  tsub[0] = '\0';
  tsub[1] = '\0';
  tsub[2] = '\0';
  tsub[3] = '\0';
  tsub[4] = '\0';
  tsub[5] = '\0';
  tsub[6] = '\0';
  tsub[7] = '\0';
  tsub[8] = '\0';
  tsub[9] = '\0';
  tsub[10] = '\0';
  tsub[0xb] = '\0';
  tsub[0xc] = '\0';
  tsub[0xd] = '\0';
  tsub[0xe] = '\0';
  tsub[0xf] = '\0';
  tsub[0x10] = '\0';
  tsub[0x11] = '\0';
  tsub[0x12] = '\0';
  tsub[0x13] = '\0';
  tsub[0x14] = '\0';
  tsub[0x15] = '\0';
  tsub[0x16] = '\0';
  tsub[0x17] = '\0';
  tsub[0x18] = '\0';
  tsub[0x19] = '\0';
  tsub[0x1a] = '\0';
  tsub[0x1b] = '\0';
  tsub[0x1c] = '\0';
  tsub[0x1d] = '\0';
  tsub[0x1e] = '\0';
  tsub[0x1f] = '\0';
  lVar5 = 0;
  bVar2 = *str;
  while (bVar2 != 0) {
    tsub[bVar2 & 0x1f] = tsub[bVar2 & 0x1f] + '\x01';
    lVar4 = lVar5 + 1;
    lVar5 = lVar5 + 1;
    bVar2 = str[lVar4];
  }
  lVar4 = 0;
  uVar8 = (uint)bVar1;
  do {
    local_68[uVar8 & 0x1f] = local_68[uVar8 & 0x1f] + '\x01';
    lVar3 = lVar4 + 1;
    uVar8 = (uint)(byte)sub[lVar3];
    lVar4 = lVar4 + 1;
  } while (sub[lVar3] != 0);
  uVar6 = (ulong)((int)lVar5 + 1) - lVar4;
  if (0 < (int)uVar6) {
    lVar5 = 0;
    do {
      if (tsub[lVar5] < local_68[lVar5]) {
        return (char *)0x0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    uVar11 = 0;
    pcVar10 = str;
    do {
      lVar5 = 0;
      uVar8 = (uint)bVar1;
      while( true ) {
        bVar2 = pcVar10[lVar5];
        bVar9 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar9 = bVar2;
        }
        bVar2 = (byte)uVar8;
        bVar7 = bVar2 | 0x20;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          bVar7 = bVar2;
        }
        if (bVar9 != bVar7) break;
        lVar4 = lVar5 + 1;
        uVar8 = (uint)(byte)sub[lVar4];
        lVar5 = lVar5 + 1;
        if (sub[lVar4] == 0) {
          return str + uVar11;
        }
      }
      uVar11 = uVar11 + 1;
      pcVar10 = pcVar10 + 1;
    } while (uVar11 != (uVar6 & 0xffffffff));
  }
  return (char *)0x0;
}

Assistant:

char *strstri(const char *str, const char *sub)
{
    const char *s1, *s2;
    int i, k;
# define TABSIZ 0x20	/* 0x40 would be case-sensitive */
    char tstr[TABSIZ], tsub[TABSIZ];	/* nibble count tables */

    /* special case: empty substring */
    if (!*sub)	return (char *) str;

    /* do some useful work while determining relative lengths */
    for (i = 0; i < TABSIZ; i++)  tstr[i] = tsub[i] = 0;	/* init */
    for (k = 0, s1 = str; *s1; k++)  tstr[*s1++ & (TABSIZ-1)]++;
    for (	s2 = sub; *s2; --k)  tsub[*s2++ & (TABSIZ-1)]++;

    /* evaluate the info we've collected */
    if (k < 0)	return NULL;  /* sub longer than str, so can't match */
    for (i = 0; i < TABSIZ; i++)	/* does sub have more 'x's than str? */
	if (tsub[i] > tstr[i])	return NULL;  /* match not possible */

    /* now actually compare the substring repeatedly to parts of the string */
    for (i = 0; i <= k; i++) {
	s1 = &str[i];
	s2 = sub;
	while (lowc(*s1++) == lowc(*s2++))
	    if (!*s2)  return (char *) &str[i];		/* full match */
    }
    return NULL;	/* not found */
}